

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O2

int archive_read_disk_set_standard_lookup(archive *a)

{
  undefined8 *private_data;
  undefined8 *private_data_00;
  int iVar1;
  
  private_data = (undefined8 *)malloc(0x818);
  private_data_00 = (undefined8 *)malloc(0x818);
  if (private_data == (undefined8 *)0x0 || private_data_00 == (undefined8 *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate uname/gname lookup cache");
    free(private_data);
    free(private_data_00);
    iVar1 = -0x1e;
  }
  else {
    iVar1 = 0;
    memset(private_data + 1,0,0x810);
    *private_data = a;
    private_data[4] = 0x7f;
    memset(private_data_00 + 1,0,0x810);
    *private_data_00 = a;
    private_data_00[4] = 0x7f;
    archive_read_disk_set_gname_lookup(a,private_data_00,lookup_gname,cleanup);
    archive_read_disk_set_uname_lookup(a,private_data,lookup_uname,cleanup);
  }
  return iVar1;
}

Assistant:

int
archive_read_disk_set_standard_lookup(struct archive *a)
{
	struct name_cache *ucache = malloc(sizeof(struct name_cache));
	struct name_cache *gcache = malloc(sizeof(struct name_cache));

	if (ucache == NULL || gcache == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate uname/gname lookup cache");
		free(ucache);
		free(gcache);
		return (ARCHIVE_FATAL);
	}

	memset(ucache, 0, sizeof(*ucache));
	ucache->archive = a;
	ucache->size = name_cache_size;
	memset(gcache, 0, sizeof(*gcache));
	gcache->archive = a;
	gcache->size = name_cache_size;

	archive_read_disk_set_gname_lookup(a, gcache, lookup_gname, cleanup);
	archive_read_disk_set_uname_lookup(a, ucache, lookup_uname, cleanup);

	return (ARCHIVE_OK);
}